

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlIconvConvert(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  int iVar4;
  char *icv_out;
  char *icv_in;
  size_t icv_outlen;
  size_t icv_inlen;
  
  if ((((outlen == (int *)0x0) || (in == (uchar *)0x0)) || (out == (uchar *)0x0)) ||
     (inlen == (int *)0x0)) {
    iVar4 = -1;
    if (outlen != (int *)0x0) {
      *outlen = 0;
    }
  }
  else {
    icv_inlen = (size_t)*inlen;
    icv_outlen = (size_t)*outlen;
    icv_out = (char *)out;
    icv_in = (char *)in;
    sVar2 = iconv(*vctxt,&icv_in,&icv_inlen,&icv_out,&icv_outlen);
    *inlen = *inlen - (int)icv_inlen;
    *outlen = *outlen - (int)icv_outlen;
    iVar4 = 0;
    if (sVar2 == 0xffffffffffffffff) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      if (iVar1 == 0x54) {
        iVar4 = -2;
      }
      else if (iVar1 != 0x16) {
        if (iVar1 == 7) {
          iVar4 = -3;
        }
        else {
          iVar4 = -1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int
xmlIconvConvert(unsigned char *out, int *outlen,
                const unsigned char *in, int *inlen, void *vctxt) {
    xmlIconvCtxt *ctxt = vctxt;
    size_t icv_inlen, icv_outlen;
    const char *icv_in = (const char *) in;
    char *icv_out = (char *) out;
    size_t ret;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL) || (in == NULL)) {
        if (outlen != NULL) *outlen = 0;
        return(XML_ENC_ERR_INTERNAL);
    }
    icv_inlen = *inlen;
    icv_outlen = *outlen;
    /*
     * Some versions take const, other versions take non-const input.
     */
    ret = iconv(ctxt->cd, (void *) &icv_in, &icv_inlen, &icv_out, &icv_outlen);
    *inlen -= icv_inlen;
    *outlen -= icv_outlen;
    if (ret == (size_t) -1) {
        if (errno == EILSEQ)
            return(XML_ENC_ERR_INPUT);
        if (errno == E2BIG)
            return(XML_ENC_ERR_SPACE);
        /*
         * EINVAL means a truncated multi-byte sequence at the end
         * of the input buffer. We treat this as success.
         */
        if (errno == EINVAL)
            return(XML_ENC_ERR_SUCCESS);
#ifdef __APPLE__
        /*
         * Apple's new libiconv can return EOPNOTSUPP under
         * unknown circumstances (detected when fuzzing).
         */
        if (errno == EOPNOTSUPP)
            return(XML_ENC_ERR_INPUT);
#endif
        return(XML_ENC_ERR_INTERNAL);
    }
    return(XML_ENC_ERR_SUCCESS);
}